

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl3_prf(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
            size_t dlen)

{
  uchar local_128 [8];
  uchar sha1sum [20];
  uchar local_108 [8];
  uchar padding [16];
  mbedtls_sha1_context sha1;
  mbedtls_md5_context md5;
  size_t i;
  uchar *dstbuf_local;
  size_t rlen_local;
  uchar *random_local;
  char *label_local;
  size_t slen_local;
  uchar *secret_local;
  
  mbedtls_md5_init((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_init((mbedtls_sha1_context *)(padding + 0xc));
  md5.buffer[0x38] = '\0';
  md5.buffer[0x39] = '\0';
  md5.buffer[0x3a] = '\0';
  md5.buffer[0x3b] = '\0';
  md5.buffer[0x3c] = '\0';
  md5.buffer[0x3d] = '\0';
  md5.buffer[0x3e] = '\0';
  md5.buffer[0x3f] = '\0';
  for (; (ulong)md5.buffer._56_8_ < dlen >> 4; md5.buffer._56_8_ = md5.buffer._56_8_ + 1) {
    memset(local_108,(uint)(byte)(md5.buffer[0x38] + 0x41),md5.buffer._56_8_ + 1);
    mbedtls_sha1_starts((mbedtls_sha1_context *)(padding + 0xc));
    mbedtls_sha1_update((mbedtls_sha1_context *)(padding + 0xc),local_108,md5.buffer._56_8_ + 1);
    mbedtls_sha1_update((mbedtls_sha1_context *)(padding + 0xc),secret,slen);
    mbedtls_sha1_update((mbedtls_sha1_context *)(padding + 0xc),random,rlen);
    mbedtls_sha1_finish((mbedtls_sha1_context *)(padding + 0xc),local_128);
    mbedtls_md5_starts((mbedtls_md5_context *)(sha1.buffer + 0x38));
    mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),secret,slen);
    mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),local_128,0x14);
    mbedtls_md5_finish((mbedtls_md5_context *)(sha1.buffer + 0x38),dstbuf + md5.buffer._56_8_ * 0x10
                      );
  }
  mbedtls_md5_free((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_free((mbedtls_sha1_context *)(padding + 0xc));
  mbedtls_zeroize(local_108,0x10);
  mbedtls_zeroize(local_128,0x14);
  return 0;
}

Assistant:

static int ssl3_prf( const unsigned char *secret, size_t slen,
                     const char *label,
                     const unsigned char *random, size_t rlen,
                     unsigned char *dstbuf, size_t dlen )
{
    size_t i;
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;
    unsigned char padding[16];
    unsigned char sha1sum[20];
    ((void)label);

    mbedtls_md5_init(  &md5  );
    mbedtls_sha1_init( &sha1 );

    /*
     *  SSLv3:
     *    block =
     *      MD5( secret + SHA1( 'A'    + secret + random ) ) +
     *      MD5( secret + SHA1( 'BB'   + secret + random ) ) +
     *      MD5( secret + SHA1( 'CCC'  + secret + random ) ) +
     *      ...
     */
    for( i = 0; i < dlen / 16; i++ )
    {
        memset( padding, (unsigned char) ('A' + i), 1 + i );

        mbedtls_sha1_starts( &sha1 );
        mbedtls_sha1_update( &sha1, padding, 1 + i );
        mbedtls_sha1_update( &sha1, secret, slen );
        mbedtls_sha1_update( &sha1, random, rlen );
        mbedtls_sha1_finish( &sha1, sha1sum );

        mbedtls_md5_starts( &md5 );
        mbedtls_md5_update( &md5, secret, slen );
        mbedtls_md5_update( &md5, sha1sum, 20 );
        mbedtls_md5_finish( &md5, dstbuf + i * 16 );
    }

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    mbedtls_zeroize( padding, sizeof( padding ) );
    mbedtls_zeroize( sha1sum, sizeof( sha1sum ) );

    return( 0 );
}